

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_direct
          (xml_buffered_writer *this,char_t *data,size_t length)

{
  size_t unaff_R12;
  
  flush(this,this->buffer,this->bufsize);
  this->bufsize = 0;
  if (0x800 < length) {
    if (this->encoding == encoding_utf8) {
      (*this->writer->_vptr_xml_writer[2])(this->writer,data,length);
      return;
    }
    do {
      if ((data[0x7ff] & 0xc0U) != 0x80) {
        unaff_R12 = 0x7ff;
      }
      if (unaff_R12 == 0) {
        __assert_fail("chunk_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                      ,0xea5,
                      "void pugi::impl::(anonymous namespace)::xml_buffered_writer::write_direct(const char_t *, size_t)"
                     );
      }
      flush(this,data,unaff_R12);
      data = data + unaff_R12;
      length = length - unaff_R12;
    } while (0x800 < length);
    this->bufsize = 0;
  }
  memcpy(this->buffer + this->bufsize,data,length);
  this->bufsize = this->bufsize + length;
  return;
}

Assistant:

void write_direct(const char_t* data, size_t length)
		{
			// flush the remaining buffer contents
			flush();

			// handle large chunks
			if (length > bufcapacity)
			{
				if (encoding == get_write_native_encoding())
				{
					// fast path, can just write data chunk
					writer.write(data, length * sizeof(char_t));
					return;
				}

				// need to convert in suitable chunks
				while (length > bufcapacity)
				{
					// get chunk size by selecting such number of characters that are guaranteed to fit into scratch buffer
					// and form a complete codepoint sequence (i.e. discard start of last codepoint if necessary)
					size_t chunk_size = get_valid_length(data, bufcapacity);
					assert(chunk_size);

					// convert chunk and write
					flush(data, chunk_size);

					// iterate
					data += chunk_size;
					length -= chunk_size;
				}

				// small tail is copied below
				bufsize = 0;
			}

			memcpy(buffer + bufsize, data, length * sizeof(char_t));
			bufsize += length;
		}